

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O1

TA_RetCode TA_ParamHolderAlloc(TA_FuncHandle *handle,TA_ParamHolder **allocatedParams)

{
  double dVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  int *piVar5;
  TA_ParamHolder *paramsToFree;
  void *__s;
  double *__s_00;
  void *__s_01;
  int iVar6;
  TA_RetCode TVar7;
  ulong uVar8;
  long lVar9;
  undefined8 *puVar10;
  
  if (allocatedParams == (TA_ParamHolder **)0x0 || handle == (TA_FuncHandle *)0x0) {
    return TA_BAD_PARAM;
  }
  if (*handle == 0xa201b201) {
    pvVar3 = *(void **)(handle + 2);
    if (pvVar3 == (void *)0x0) {
      return TA_INVALID_HANDLE;
    }
    paramsToFree = (TA_ParamHolder *)malloc(0x38);
    TVar7 = TA_ALLOC_ERR;
    if (paramsToFree != (TA_ParamHolder *)0x0) {
      paramsToFree->hiddenData = (void *)0x0;
      paramsToFree[1].hiddenData = (void *)0x0;
      paramsToFree[4].hiddenData = (void *)0x0;
      paramsToFree[5].hiddenData = (void *)0x0;
      paramsToFree[2].hiddenData = (void *)0x0;
      paramsToFree[3].hiddenData = (void *)0x0;
      paramsToFree[6].hiddenData = (void *)0x0;
      *(undefined4 *)&paramsToFree[1].hiddenData = 0xa202b202;
      paramsToFree->hiddenData = paramsToFree + 1;
      if (*(int *)((long)pvVar3 + 0x24) == 0) {
        return TA_INTERNAL_ERROR|TA_BAD_PARAM;
      }
      uVar8 = (ulong)(uint)(*(int *)((long)pvVar3 + 0x24) * 0x38);
      __s = malloc(uVar8);
      if (__s != (void *)0x0) {
        __s_00 = (double *)0x0;
        memset(__s,0,uVar8);
        paramsToFree[2].hiddenData = __s;
        if (*(int *)((long)pvVar3 + 0x28) != 0) {
          uVar8 = (ulong)(uint)(*(int *)((long)pvVar3 + 0x28) << 4);
          __s_00 = (double *)malloc(uVar8);
          if (__s_00 == (double *)0x0) goto LAB_0018ebc0;
          memset(__s_00,0,uVar8);
        }
        paramsToFree[3].hiddenData = __s_00;
        uVar8 = (ulong)(uint)(*(int *)((long)pvVar3 + 0x2c) << 4);
        __s_01 = malloc(uVar8);
        if (__s_01 != (void *)0x0) {
          memset(__s_01,0,uVar8);
          paramsToFree[4].hiddenData = __s_01;
          paramsToFree[6].hiddenData = pvVar3;
          uVar2 = *(uint *)((long)pvVar3 + 0x24);
          if ((ulong)uVar2 != 0) {
            lVar4 = *(long *)(handle + 4);
            iVar6 = *(int *)&paramsToFree[5].hiddenData;
            puVar10 = (undefined8 *)((long)__s + 0x30);
            uVar8 = 0;
            do {
              *puVar10 = *(undefined8 *)(lVar4 + uVar8 * 8);
              iVar6 = iVar6 * 2 + 1;
              uVar8 = uVar8 + 1;
              puVar10 = puVar10 + 7;
            } while (uVar2 != uVar8);
            *(int *)&paramsToFree[5].hiddenData = iVar6;
          }
          if (*(int *)((long)pvVar3 + 0x28) != 0) {
            lVar4 = *(long *)(handle + 6);
            uVar8 = 0;
            do {
              piVar5 = *(int **)(lVar4 + uVar8 * 8);
              __s_00[1] = (double)piVar5;
              dVar1 = *(double *)(*(long *)(lVar4 + uVar8 * 8) + 0x28);
              if (*piVar5 == 0) {
                *__s_00 = dVar1;
              }
              else {
                *(int *)__s_00 = (int)dVar1;
              }
              uVar8 = uVar8 + 1;
              __s_00 = __s_00 + 2;
            } while (uVar8 < *(uint *)((long)pvVar3 + 0x28));
          }
          uVar2 = *(uint *)((long)pvVar3 + 0x2c);
          if ((ulong)uVar2 != 0) {
            lVar4 = *(long *)(handle + 8);
            iVar6 = *(int *)((long)&paramsToFree[5].hiddenData + 4);
            lVar9 = 0;
            do {
              *(undefined8 *)((long)__s_01 + lVar9 * 2 + 8) = *(undefined8 *)(lVar4 + lVar9);
              iVar6 = iVar6 * 2 + 1;
              lVar9 = lVar9 + 8;
            } while ((ulong)uVar2 << 3 != lVar9);
            *(int *)((long)&paramsToFree[5].hiddenData + 4) = iVar6;
          }
          TVar7 = TA_SUCCESS;
          goto LAB_0018ebb4;
        }
      }
LAB_0018ebc0:
      TA_ParamHolderFree(paramsToFree);
    }
  }
  else {
    TVar7 = TA_INVALID_HANDLE;
  }
  paramsToFree = (TA_ParamHolder *)0x0;
LAB_0018ebb4:
  *allocatedParams = paramsToFree;
  return TVar7;
}

Assistant:

TA_RetCode TA_ParamHolderAlloc( const TA_FuncHandle *handle,
                                TA_ParamHolder **allocatedParams )
{
   
   TA_FuncDef *funcDef;
   unsigned int allocSize, i;
   TA_ParamHolderInput    *input;
   TA_ParamHolderOptInput *optInput;
   TA_ParamHolderOutput   *output;

   const TA_FuncInfo *funcInfo;
   TA_ParamHolder *newParams;
   TA_ParamHolderPriv *newParamsPriv;

   const TA_InputParameterInfo    **inputInfo;
   const TA_OptInputParameterInfo **optInputInfo;
   const TA_OutputParameterInfo   **outputInfo;

   /* Validate the parameters. */
   if( !handle || !allocatedParams)
   {
      return TA_BAD_PARAM;
   }

   /* Validate that this is a valid funcHandle. */
   funcDef = (TA_FuncDef *)handle;
   if( funcDef->magicNumber != TA_FUNC_DEF_MAGIC_NB )
   {
      *allocatedParams = NULL;
      return TA_INVALID_HANDLE;
   }

   /* Get the TA_FuncInfo. */
   funcInfo = funcDef->funcInfo;
   if( !funcInfo ) return TA_INVALID_HANDLE;

   /* Allocate the TA_ParamHolder. */
   newParams = (TA_ParamHolder *)TA_Malloc( sizeof(TA_ParamHolder) + sizeof(TA_ParamHolderPriv));
   if( !newParams )
   {
      *allocatedParams = NULL;
      return TA_ALLOC_ERR;
   }

   memset( newParams, 0, sizeof(TA_ParamHolder) + sizeof(TA_ParamHolderPriv) );
   newParamsPriv = (TA_ParamHolderPriv *)(((char *)newParams)+sizeof(TA_ParamHolder));
   newParamsPriv->magicNumber = TA_PARAM_HOLDER_PRIV_MAGIC_NB;
   newParams->hiddenData = newParamsPriv;

   /* From this point, TA_ParamHolderFree can be safely called. */

   /* Allocate the array of structure holding the info
    * for each parameter.
    */
   if( funcInfo->nbInput == 0 ) return TA_INTERNAL_ERROR(2);

   allocSize = (funcInfo->nbInput) * sizeof(TA_ParamHolderInput);
   input = (TA_ParamHolderInput *)TA_Malloc( allocSize );

   if( !input )
   {
      TA_ParamHolderFree( newParams );
      *allocatedParams = NULL;
      return TA_ALLOC_ERR;
   }
   memset( input, 0, allocSize );
   newParamsPriv->in = input;

   if( funcInfo->nbOptInput == 0 )
      optInput = NULL;
   else
   {
      allocSize = (funcInfo->nbOptInput) * sizeof(TA_ParamHolderOptInput);
      optInput = (TA_ParamHolderOptInput *)TA_Malloc( allocSize );

      if( !optInput )
      {
         TA_ParamHolderFree( newParams );
         *allocatedParams = NULL;
         return TA_ALLOC_ERR;
      }
      memset( optInput, 0, allocSize );
   }
   newParamsPriv->optIn = optInput;

   allocSize = (funcInfo->nbOutput) * sizeof(TA_ParamHolderOutput);
   output = (TA_ParamHolderOutput *)TA_Malloc( allocSize );
   if( !output )
   {
      TA_ParamHolderFree( newParams );
      *allocatedParams = NULL;
      return TA_ALLOC_ERR;
   }
   memset( output, 0, allocSize );
   newParamsPriv->out = output;

   newParamsPriv->funcInfo = funcInfo;

   inputInfo    = (const TA_InputParameterInfo **)funcDef->input;
   optInputInfo = (const TA_OptInputParameterInfo **)funcDef->optInput;
   outputInfo   = (const TA_OutputParameterInfo   **)funcDef->output;

   for( i=0; i < funcInfo->nbInput; i++ )
   {
      input[i].inputInfo = inputInfo[i];
      newParamsPriv->inBitmap <<= 1;
      newParamsPriv->inBitmap |= 1;
   }

   for( i=0; i < funcInfo->nbOptInput; i++ )
   {
      optInput[i].optInputInfo = optInputInfo[i];
      if( optInput[i].optInputInfo->type == TA_OptInput_RealRange )
         optInput[i].data.optInReal = optInputInfo[i]->defaultValue;
      else
         optInput[i].data.optInInteger = (TA_Integer)optInputInfo[i]->defaultValue;
   }

   for( i=0; i < funcInfo->nbOutput; i++ )
   {
      output[i].outputInfo = outputInfo[i];
      newParamsPriv->outBitmap <<= 1;
      newParamsPriv->outBitmap |= 1;
   }

   /* Succcess, return the result to the caller. */
   *allocatedParams = newParams;

   return TA_SUCCESS;
}